

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

text_input_buffer * __thiscall dtc::text_input_buffer::next_token(text_input_buffer *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  
  iVar3 = this->cursor;
  do {
    skip_spaces(this);
    bVar1 = finished(this);
    if (bVar1) {
      return this;
    }
    cVar2 = operator*(this);
    if ((cVar2 == '/') && (cVar2 = peek(this), cVar2 == '*')) {
      operator++(this);
      do {
        operator++(this);
        while (((cVar2 = operator*(this), cVar2 == '\0' || (cVar2 = operator*(this), cVar2 == '*'))
               || (bVar1 = finished(this), bVar1))) {
          operator++(this);
          cVar2 = operator*(this);
          if (((cVar2 == '\0') || (cVar2 = operator*(this), cVar2 == '/')) ||
             (bVar1 = finished(this), bVar1)) {
            operator++(this);
            goto LAB_0013a711;
          }
        }
      } while( true );
    }
LAB_0013a711:
    cVar2 = operator*(this);
    if ((cVar2 == '/') && (cVar2 = peek(this), cVar2 == '/')) {
      operator++(this);
      do {
        operator++(this);
        cVar2 = operator*(this);
        if (cVar2 == '\n') break;
        bVar1 = finished(this);
      } while (!bVar1);
      operator++(this);
    }
    bVar1 = iVar3 == this->cursor;
    iVar3 = this->cursor;
    if (bVar1) {
      return this;
    }
  } while( true );
}

Assistant:

text_input_buffer&
text_input_buffer::next_token()
{
	auto &self = *this;
	int start;
	do {
		start = cursor;
		skip_spaces();
		if (finished())
		{
			return self;
		}
		// Parse /* comments
		if (*self == '/' && peek() == '*')
		{
			// eat the start of the comment
			++self;
			++self;
			do {
				// Find the ending * of */
				while ((*self != '\0') && (*self != '*') && !finished())
				{
					++self;
				}
				// Eat the *
				++self;
			} while ((*self != '\0') && (*self != '/') && !finished());
			// Eat the /
			++self;
		}
		// Parse // comments
		if ((*self == '/' && peek() == '/'))
		{
			// eat the start of the comment
			++self;
			++self;
			// Find the ending of the line
			while (*self != '\n' && !finished())
			{
				++self;
			}
			// Eat the \n
			++self;
		}
	} while (start != cursor);
	return self;
}